

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

int undead_to_corpse(int mndx)

{
  int local_c;
  int mndx_local;
  
  switch(mndx) {
  case 0xc1:
  case 0xf5:
    local_c = 0x3c;
    break;
  case 0xc2:
  case 0xf6:
    local_c = 0xaa;
    break;
  case 0xc3:
  case 0xf7:
    local_c = 0x4a;
    break;
  case 0xc4:
  case 0xf8:
    local_c = 0x2d;
    break;
  case 0xc5:
  case 0xf9:
    local_c = 0x111;
    break;
  case 0xc6:
  case 0xe8:
  case 0xe9:
  case 0xfa:
    local_c = 0x10b;
    break;
  case 199:
  case 0xfb:
    local_c = 0xb4;
    break;
  case 200:
  case 0xfc:
    local_c = 0xae;
    break;
  default:
    local_c = mndx;
  }
  return local_c;
}

Assistant:

int undead_to_corpse(int mndx)
{
	switch (mndx) {
	case PM_KOBOLD_ZOMBIE:
	case PM_KOBOLD_MUMMY:	mndx = PM_KOBOLD;  break;
	case PM_DWARF_ZOMBIE:
	case PM_DWARF_MUMMY:	mndx = PM_DWARF;  break;
	case PM_GNOME_ZOMBIE:
	case PM_GNOME_MUMMY:	mndx = PM_GNOME;  break;
	case PM_ORC_ZOMBIE:
	case PM_ORC_MUMMY:	mndx = PM_ORC;  break;
	case PM_ELF_ZOMBIE:
	case PM_ELF_MUMMY:	mndx = PM_ELF;  break;
	case PM_VAMPIRE:
	case PM_VAMPIRE_LORD:
	case PM_HUMAN_ZOMBIE:
	case PM_HUMAN_MUMMY:	mndx = PM_HUMAN;  break;
	case PM_GIANT_ZOMBIE:
	case PM_GIANT_MUMMY:	mndx = PM_GIANT;  break;
	case PM_ETTIN_ZOMBIE:
	case PM_ETTIN_MUMMY:	mndx = PM_ETTIN;  break;
	default:  break;
	}
	return mndx;
}